

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O3

CostType __thiscall wasm::CostAnalyzer::visitSIMDTernary(CostAnalyzer *this,SIMDTernary *curr)

{
  SIMDTernaryOp SVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  SVar1 = curr->op;
  uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->a);
  uVar3 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->b);
  uVar4 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                    ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,curr->c);
  return uVar4 + uVar3 + uVar2 + (uint)(SVar1 < (LaneselectI16x8|RelaxedNmaddVecF32x4));
}

Assistant:

CostType visitSIMDTernary(SIMDTernary* curr) {
    CostType ret = 0;
    switch (curr->op) {
      case Bitselect:
      case LaneselectI8x16:
      case LaneselectI16x8:
      case LaneselectI32x4:
      case LaneselectI64x2:
      case RelaxedMaddVecF16x8:
      case RelaxedNmaddVecF16x8:
      case RelaxedMaddVecF32x4:
      case RelaxedNmaddVecF32x4:
      case RelaxedMaddVecF64x2:
      case RelaxedNmaddVecF64x2:
      case DotI8x16I7x16AddSToVecI32x4:
        ret = 1;
        break;
    }
    return ret + visit(curr->a) + visit(curr->b) + visit(curr->c);
  }